

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::CreateObjectLists
          (cmMakefileTargetGenerator *this,bool useLinkScript,bool useArchiveRules,
          bool useResponseFile,string *buildObjs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,bool useWatcomQuote,ResponseFlagFor responseMode)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  ulong uVar2;
  size_type sVar3;
  char *__s;
  reference pvVar4;
  string_view source;
  char local_201;
  cmAlphaNum local_200;
  cmAlphaNum local_1d0;
  string local_1a0;
  undefined1 local_180 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objStrings;
  string local_158;
  undefined1 local_138 [8];
  string objects_rsp;
  allocator<char> local_f1;
  undefined1 local_f0 [8];
  string responseFileName;
  char *pcStack_c8;
  uint i;
  char *sep;
  string responseFlag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  object_strings;
  size_type responseFileLimit;
  undefined1 local_70 [8];
  string variableNameExternal;
  string variableName;
  bool useWatcomQuote_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends_local;
  string *buildObjs_local;
  bool useResponseFile_local;
  bool useArchiveRules_local;
  bool useLinkScript_local;
  cmMakefileTargetGenerator *this_local;
  
  std::__cxx11::string::string((string *)(variableNameExternal.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_70);
  WriteObjectsVariable
            (this,(string *)(variableNameExternal.field_2._M_local_buf + 8),(string *)local_70,
             useWatcomQuote);
  if (useResponseFile) {
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&responseFlag.field_2 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00);
    WriteObjectsStrings(this,this_00,0x1ffb8);
    GetResponseFlag_abi_cxx11_((string *)&sep,this,responseMode);
    pcStack_c8 = "";
    for (responseFileName.field_2._12_4_ = 0; uVar2 = (ulong)(uint)responseFileName.field_2._12_4_,
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&responseFlag.field_2 + 8)), uVar2 < sVar3;
        responseFileName.field_2._12_4_ = responseFileName.field_2._12_4_ + 1) {
      __s = "deviceObjects";
      if (responseMode == Link) {
        __s = "objects";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,__s,&local_f1);
      std::allocator<char>::~allocator(&local_f1);
      std::__cxx11::to_string
                ((string *)((long)&objects_rsp.field_2 + 8),responseFileName.field_2._12_4_ + 1);
      std::__cxx11::string::operator+=
                ((string *)local_f0,(string *)(objects_rsp.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(objects_rsp.field_2._M_local_buf + 8));
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&responseFlag.field_2 + 8),
                            (ulong)(uint)responseFileName.field_2._12_4_);
      CreateResponseFile((string *)local_138,this,(string *)local_f0,pvVar4,makefile_depends);
      std::__cxx11::string::operator+=((string *)buildObjs,pcStack_c8);
      pcStack_c8 = " ";
      std::__cxx11::string::operator+=((string *)buildObjs,(string *)&sep);
      pcVar1 = this->LocalGenerator;
      source = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_138);
      objStrings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)source._M_len;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_158,
                 &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
      std::__cxx11::string::operator+=((string *)buildObjs,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)local_138);
      std::__cxx11::string::~string((string *)local_f0);
    }
    std::__cxx11::string::~string((string *)&sep);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&responseFlag.field_2 + 8));
  }
  else if (useLinkScript) {
    if (!useArchiveRules) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_180);
      WriteObjectsStrings(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_180,0xffffffffffffffff);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_180,0);
      std::__cxx11::string::operator=((string *)buildObjs,(string *)pvVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_180);
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_1d0,"$(");
    cmAlphaNum::cmAlphaNum(&local_200,(string *)((long)&variableNameExternal.field_2 + 8));
    local_201 = ')';
    cmStrCat<char[5],std::__cxx11::string,char>
              (&local_1a0,&local_1d0,&local_200,(char (*) [5])") $(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               &local_201);
    std::__cxx11::string::operator=((string *)buildObjs,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(variableNameExternal.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateObjectLists(
  bool useLinkScript, bool useArchiveRules, bool useResponseFile,
  std::string& buildObjs, std::vector<std::string>& makefile_depends,
  bool useWatcomQuote, ResponseFlagFor responseMode)
{
  std::string variableName;
  std::string variableNameExternal;
  this->WriteObjectsVariable(variableName, variableNameExternal,
                             useWatcomQuote);
  if (useResponseFile) {
    // MSVC response files cannot exceed 128K.
    std::string::size_type const responseFileLimit = 131000;

    // Construct the individual object list strings.
    std::vector<std::string> object_strings;
    this->WriteObjectsStrings(object_strings, responseFileLimit);

    // Lookup the response file reference flag.
    std::string responseFlag = this->GetResponseFlag(responseMode);

    // Write a response file for each string.
    const char* sep = "";
    for (unsigned int i = 0; i < object_strings.size(); ++i) {
      // Number the response files.
      std::string responseFileName =
        (responseMode == Link) ? "objects" : "deviceObjects";
      responseFileName += std::to_string(i + 1);

      // Create this response file.
      std::string objects_rsp = this->CreateResponseFile(
        responseFileName, object_strings[i], makefile_depends);

      // Separate from previous response file references.
      buildObjs += sep;
      sep = " ";

      // Reference the response file.
      buildObjs += responseFlag;
      buildObjs += this->LocalGenerator->ConvertToOutputFormat(
        objects_rsp, cmOutputConverter::SHELL);
    }
  } else if (useLinkScript) {
    if (!useArchiveRules) {
      std::vector<std::string> objStrings;
      this->WriteObjectsStrings(objStrings);
      buildObjs = objStrings[0];
    }
  } else {
    buildObjs =
      cmStrCat("$(", variableName, ") $(", variableNameExternal, ')');
  }
}